

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JPG.cpp
# Opt level: O2

void __thiscall JPG::subsampling(JPG *this)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  uint uVar5;
  MCU *pMVar6;
  Block *padVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  Block **ppadVar11;
  uint uVar12;
  uint uVar13;
  uint componentID;
  uint ID;
  uint uVar14;
  uint uVar15;
  long lVar16;
  uint x;
  uint uVar17;
  long lVar18;
  double dVar19;
  uint yOffSet;
  uint xOffset;
  double *local_48;
  
  for (uVar12 = 0; uVar12 < this->mcuHeight; uVar12 = uVar12 + 1) {
    uVar13 = 0;
    while( true ) {
      uVar5 = this->mcuWidth;
      if (uVar5 <= uVar13) break;
      pMVar6 = this->data;
      bVar1 = this->maxVerticalSamplingFrequency;
      bVar2 = this->maxHorizontalSamplingFrequency;
      for (ID = 1; ID != 4; ID = ID + 1) {
        uVar15 = 0;
        yOffSet = (uint)bVar1 * uVar12 * 8;
        while( true ) {
          uVar8 = getVerticalSamplingFrequency(this,ID);
          if (uVar8 <= uVar15) break;
          uVar17 = 0;
          xOffset = bVar2 * uVar13 * 8;
          while( true ) {
            uVar8 = getHorizontalSamplingFrequency(this,ID);
            if (uVar8 <= uVar17) break;
            ppadVar11 = MCU::operator[](pMVar6 + (uVar5 * uVar12 + uVar13),ID);
            padVar7 = *ppadVar11;
            uVar8 = getHorizontalSamplingFrequency(this,ID);
            local_48 = padVar7[uVar8 * uVar15 + uVar17];
            for (lVar16 = 0; lVar16 != 8; lVar16 = lVar16 + 1) {
              for (lVar18 = 0; lVar18 != 8; lVar18 = lVar18 + 1) {
                bVar3 = this->maxVerticalSamplingFrequency;
                uVar8 = getVerticalSamplingFrequency(this,ID);
                bVar4 = this->maxHorizontalSamplingFrequency;
                uVar9 = getHorizontalSamplingFrequency(this,ID);
                uVar10 = ((uint)bVar4 * (int)lVar18) / uVar9 + xOffset;
                dVar19 = 0.0;
                if ((uVar10 < this->width) &&
                   (uVar14 = ((uint)bVar3 * (int)lVar16) / uVar8 + yOffSet, uVar14 < this->height))
                {
                  dVar19 = YCbCr::operator[](this->BMPData + (this->width * uVar14 + uVar10),ID);
                }
                local_48[lVar18] = dVar19;
              }
              local_48 = local_48 + 8;
            }
            uVar17 = uVar17 + 1;
            xOffset = xOffset + 8;
          }
          uVar15 = uVar15 + 1;
          yOffSet = yOffSet + 8;
        }
      }
      uVar13 = uVar13 + 1;
    }
  }
  return;
}

Assistant:

void JPG::subsampling() {
    //遍历mcu
    for (uint i = 0; i < mcuHeight; i++) {
        for (uint j = 0; j < mcuWidth; j++) {
            MCU& currentMCU = data[i * mcuWidth + j];
            uint heightOffset = i * maxVerticalSamplingFrequency * 8;
            uint widthOffset = j * maxHorizontalSamplingFrequency * 8;
            //iterate over 每一个component Y, cb cr
            for (uint componentID = 1; componentID <= 3; componentID++) {
                //遍历block
                for(uint ii = 0, yOffSet = heightOffset; ii < getVerticalSamplingFrequency(componentID); ii++, yOffSet = yOffSet + 8) {
                    for(uint jj = 0, xOffset = widthOffset; jj < getHorizontalSamplingFrequency(componentID); jj++, xOffset = xOffset + 8) {
                        Block& currentBlock = currentMCU[componentID][ii * getHorizontalSamplingFrequency(componentID) + jj];
                        //遍历Block every pixels 像素
                        for(uint y = 0; y < 8; y++) {
                            for(uint x = 0; x < 8; x++) {
                                uint sampledY = yOffSet + y *  maxVerticalSamplingFrequency / getVerticalSamplingFrequency(componentID);
                                uint sampledX = xOffset + x * maxHorizontalSamplingFrequency / getHorizontalSamplingFrequency(componentID);
                                //cannot find in original pictures;
                                if(sampledX >= width || sampledY >= height) {
                                    currentBlock[y * 8 + x] = 0;
                                } else {
                                    currentBlock[y * 8 + x] = BMPData[sampledY * width + sampledX][componentID];
                                }
                            }
                        }
                    }
                }             
            }
        }
    }  
}